

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O1

void __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::
treeEditDist(APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
             *this,TreeIndexAPTED *t1,TreeIndexAPTED *t2,int it1subtree,int it2subtree,
            Matrix<double> *forestdist,bool treesSwapped)

{
  size_t row;
  longlong *plVar1;
  size_t sVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  pointer piVar12;
  TreeIndexAPTED *pTVar13;
  long lVar14;
  TreeIndexAPTED *pTVar15;
  int iVar16;
  double *pdVar17;
  size_t sVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  size_t sVar24;
  size_t col;
  uint uVar25;
  double dVar26;
  double dVar27;
  float fVar28;
  
  iVar7 = (t1->super_PreLToPostL).prel_to_postl_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[it1subtree];
  iVar8 = (t2->super_PreLToPostL).prel_to_postl_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[it2subtree];
  iVar9 = (t1->super_PostLToLLD).postl_to_lld_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_start[iVar7];
  iVar10 = (t2->super_PostLToLLD).postl_to_lld_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar8];
  iVar19 = iVar10 + -1;
  pdVar17 = data_structures::Matrix<double>::at(forestdist,0,0);
  *pdVar17 = 0.0;
  iVar23 = (int)((long)iVar9 + -1);
  if (iVar23 < iVar7) {
    sVar24 = 1;
    do {
      pdVar17 = data_structures::Matrix<double>::read_at(forestdist,sVar24 - 1,0);
      dVar26 = *pdVar17;
      pdVar17 = data_structures::Matrix<double>::at(forestdist,sVar24,0);
      *pdVar17 = dVar26 + 1.0;
      sVar24 = sVar24 + 1;
    } while ((iVar7 - iVar9) + 2 != sVar24);
  }
  if (iVar19 < iVar8) {
    sVar24 = 1;
    do {
      pdVar17 = data_structures::Matrix<double>::read_at(forestdist,0,sVar24 - 1);
      dVar26 = *pdVar17;
      pdVar17 = data_structures::Matrix<double>::at(forestdist,0,sVar24);
      *pdVar17 = dVar26 + 1.0;
      sVar24 = sVar24 + 1;
    } while ((iVar8 - iVar10) + 2 != sVar24);
  }
  if (0 < iVar7 - iVar23) {
    lVar21 = (long)iVar19;
    iVar16 = iVar23;
    pTVar15 = t1;
    if (treesSwapped) {
      iVar16 = iVar19;
      pTVar15 = t2;
    }
    iVar20 = iVar19;
    pTVar13 = t2;
    if (treesSwapped) {
      iVar20 = iVar23;
      pTVar13 = t1;
    }
    sVar24 = 1;
    do {
      if (0 < iVar8 - iVar19) {
        row = sVar24 - 1;
        lVar3 = (long)iVar9 + -1 + sVar24;
        col = 1;
        do {
          plVar1 = &(this->
                    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                    ).subproblem_counter_;
          *plVar1 = *plVar1 + 1;
          sVar18 = col;
          sVar2 = sVar24;
          if (treesSwapped) {
            sVar18 = sVar24;
            sVar2 = col;
          }
          dVar26 = 0.0;
          if ((pTVar15->super_PostLToLabelId).postl_to_label_id_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [sVar2 + (long)iVar16] !=
              (pTVar13->super_PostLToLabelId).postl_to_label_id_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [sVar18 + (long)iVar20]) {
            dVar26 = 1.0;
          }
          pdVar17 = data_structures::Matrix<double>::read_at(forestdist,row,col);
          dVar4 = *pdVar17;
          sVar2 = col - 1;
          pdVar17 = data_structures::Matrix<double>::read_at(forestdist,sVar24,sVar2);
          dVar5 = *pdVar17;
          piVar12 = (t1->super_PostLToLLD).postl_to_lld_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          iVar23 = piVar12[lVar3];
          if ((iVar23 == piVar12[iVar7]) &&
             (piVar12 = (t2->super_PostLToLLD).postl_to_lld_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start, piVar12[lVar21 + col] == piVar12[iVar8]))
          {
            pdVar17 = data_structures::Matrix<double>::read_at(forestdist,row,sVar2);
            dVar27 = *pdVar17;
            pdVar17 = data_structures::Matrix<double>::read_at(forestdist,row,sVar2);
            dVar6 = *pdVar17;
            if (treesSwapped) {
              iVar23 = (t2->super_PostLToPreL).postl_to_prel_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[lVar21 + col];
              iVar11 = (t1->super_PostLToPreL).postl_to_prel_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[lVar3];
            }
            else {
              iVar23 = (t1->super_PostLToPreL).postl_to_prel_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[lVar3];
              iVar11 = (t2->super_PostLToPreL).postl_to_prel_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[lVar21 + col];
            }
            pdVar17 = data_structures::Matrix<double>::at(&this->delta_,(long)iVar23,(long)iVar11);
            *pdVar17 = dVar6;
          }
          else {
            pdVar17 = data_structures::Matrix<double>::read_at
                                (forestdist,(long)(iVar23 - iVar9),
                                 (long)((t2->super_PostLToLLD).postl_to_lld_.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start[lVar21 + col] - iVar10));
            dVar27 = *pdVar17;
            lVar22 = lVar21 + col;
            lVar14 = lVar3;
            if (treesSwapped) {
              lVar22 = lVar3;
              lVar14 = lVar21 + col;
            }
            pdVar17 = data_structures::Matrix<double>::read_at
                                (&this->delta_,
                                 (long)(pTVar15->super_PostLToPreL).postl_to_prel_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[lVar14],
                                 (long)(pTVar13->super_PostLToPreL).postl_to_prel_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[lVar22]);
            dVar27 = dVar27 + *pdVar17;
          }
          uVar25 = -(uint)((float)(dVar5 + 1.0) <= (float)(dVar4 + 1.0));
          fVar28 = (float)(~uVar25 & (uint)(float)(dVar4 + 1.0) |
                          (uint)(float)(dVar5 + 1.0) & uVar25);
          uVar25 = -(uint)((float)(dVar26 + dVar27) <= fVar28);
          pdVar17 = data_structures::Matrix<double>::at(forestdist,sVar24,col);
          *pdVar17 = (double)(float)(uVar25 & (uint)(float)(dVar26 + dVar27) |
                                    ~uVar25 & (uint)fVar28);
          col = col + 1;
        } while ((iVar8 - iVar10) + 2 != col);
      }
      sVar24 = sVar24 + 1;
    } while (sVar24 != (iVar7 - iVar9) + 2);
  }
  return;
}

Assistant:

void APTEDTreeIndex<CostModel, TreeIndex>::treeEditDist(const TreeIndex& t1,
    const TreeIndex& t2, int it1subtree, int it2subtree,
    data_structures::Matrix<double>& forestdist, bool treesSwapped) {
  // Translate input subtree root nodes to left-to-right postorder.
  int i = t1.prel_to_postl_[it1subtree];
  int j = t2.prel_to_postl_[it2subtree];
  // We need to offset the node ids for accessing forestdist array which has
  // indices from 0 to subtree size. However, the subtree node indices do not
  // necessarily start with 0.
  // Whenever the original left-to-right postorder id has to be accessed, use
  // i+ioff and j+joff.
  int ioff = t1.postl_to_lld_[i] - 1;
  int joff = t2.postl_to_lld_[j] - 1;
  // Variables holding costs of each minimum element.
  float da = 0;
  float db = 0;
  float dc = 0;
  // Initialize forestdist array with deletion and insertion costs of each
  // relevant subforest.
  forestdist.at(0, 0) = 0;
  for (int i1 = 1; i1 <= i - ioff; ++i1) {
    forestdist.at(i1, 0) = forestdist.read_at(i1 - 1, 0) + (treesSwapped ? c_.ins(t1.postl_to_label_id_[i1 + ioff]) : c_.del(t1.postl_to_label_id_[i1 + ioff])); // TODO: USE COST MODEL - delete i1.
  }
  for (int j1 = 1; j1 <= j - joff; ++j1) {
    forestdist.at(0, j1) = forestdist.read_at(0, j1 - 1) + (treesSwapped ? c_.del(t2.postl_to_label_id_[j1 + joff]) : c_.ins(t2.postl_to_label_id_[j1 + joff])); // TODO: USE COST MODEL - insert j1.
  }
  // Fill in the remaining costs.
  for (int i1 = 1; i1 <= i - ioff; ++i1) {
    for (int j1 = 1; j1 <= j - joff; ++j1) {
      // Increment the number of subproblems.
      ++subproblem_counter_;
      // Calculate partial distance values for this subproblem.
      double u = (treesSwapped ? c_.ren(t2.postl_to_label_id_[j1 + joff], t1.postl_to_label_id_[i1 + ioff]) : c_.ren(t1.postl_to_label_id_[i1 + ioff], t2.postl_to_label_id_[j1 + joff])); // TODO: USE COST MODEL - rename i1 to j1.
      da = forestdist.read_at(i1 - 1, j1) + (treesSwapped ? c_.ins(t1.postl_to_label_id_[i1 + ioff]) : c_.del(t1.postl_to_label_id_[i1 + ioff])); // TODO: USE COST MODEL - delete i1.
      db = forestdist.read_at(i1, j1 - 1) + (treesSwapped ? c_.del(t2.postl_to_label_id_[j1 + joff]) : c_.ins(t2.postl_to_label_id_[j1 + joff])); // TODO: USE COST MODEL - insert j1.
      // If current subforests are subtrees.
      if (t1.postl_to_lld_[i1 + ioff] == t1.postl_to_lld_[i] && t2.postl_to_lld_[j1 + joff] == t2.postl_to_lld_[j]) {
        dc = forestdist.read_at(i1 - 1, j1 - 1) + u;
        // Store the relevant distance value in delta array.
        if (treesSwapped) {
          delta_.at(t2.postl_to_prel_[j1 + joff], t1.postl_to_prel_[i1 + ioff]) = forestdist.read_at(i1 - 1, j1 - 1);
        } else {
          delta_.at(t1.postl_to_prel_[i1 + ioff], t2.postl_to_prel_[j1 + joff]) = forestdist.read_at(i1 - 1, j1 - 1);
        }
      } else {
        dc = forestdist.read_at(t1.postl_to_lld_[i1 + ioff] - 1 - ioff, t2.postl_to_lld_[j1 + joff] - 1 - joff) +
          (treesSwapped ? delta_.read_at(t2.postl_to_prel_[j1 + joff], t1.postl_to_prel_[i1 + ioff]) : delta_.read_at(t1.postl_to_prel_[i1 + ioff], t2.postl_to_prel_[j1 + joff])) + u;
      }
      // Calculate final minimum.
      forestdist.at(i1, j1) = da >= db ? db >= dc ? dc : db : da >= dc ? dc : da;
    }
  }
}